

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig::operator==
          (HeapprofdConfig_ContinuousDumpConfig *this,HeapprofdConfig_ContinuousDumpConfig *other)

{
  __type_conflict4 _Var1;
  bool local_19;
  HeapprofdConfig_ContinuousDumpConfig *other_local;
  HeapprofdConfig_ContinuousDumpConfig *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if ((_Var1) && (local_19 = false, this->dump_phase_ms_ == other->dump_phase_ms_)) {
    local_19 = this->dump_interval_ms_ == other->dump_interval_ms_;
  }
  return local_19;
}

Assistant:

bool HeapprofdConfig_ContinuousDumpConfig::operator==(const HeapprofdConfig_ContinuousDumpConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && dump_phase_ms_ == other.dump_phase_ms_
   && dump_interval_ms_ == other.dump_interval_ms_;
}